

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

DBErrors __thiscall wallet::CWallet::LoadWallet(CWallet *this)

{
  long lVar1;
  DBErrors DVar2;
  int iVar3;
  WalletDatabase *pWVar4;
  _Base_ptr p_Var5;
  pointer *__ptr;
  long in_FS_OFFSET;
  WalletBatch local_48;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock50,&this->cs_wallet,"cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x937,false);
  local_48.m_batch._M_t.
  super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t.
  super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
  super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl._0_1_ =
       (this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
  inline_assertion_check<true,bool>
            ((bool *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x939,"LoadWallet","m_spk_managers.empty()");
  local_48.m_batch._M_t.
  super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t.
  super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
  super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl._0_1_ =
       (this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i == 0;
  inline_assertion_check<true,bool>
            ((bool *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x93a,"LoadWallet","m_wallet_flags == 0");
  pWVar4 = GetDatabase(this);
  (*pWVar4->_vptr_WalletDatabase[0xe])(&local_48,pWVar4,1);
  local_48.m_database = pWVar4;
  DVar2 = WalletBatch::LoadWallet(&local_48,this);
  if ((long *)CONCAT71(local_48.m_batch._M_t.
                       super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                       .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl._1_7_,
                       local_48.m_batch._M_t.
                       super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                       .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl._0_1_) !=
      (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_48.m_batch._M_t.
                                   super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                                   .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>.
                                   _M_head_impl._1_7_,
                                   local_48.m_batch._M_t.
                                   super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                                   .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>.
                                   _M_head_impl._0_1_) + 0x28))();
  }
  if (DVar2 == NEED_REWRITE) {
    pWVar4 = GetDatabase(this);
    iVar3 = (*pWVar4->_vptr_WalletDatabase[5])(pWVar4,"\x04pool");
    if ((char)iVar3 != '\0') {
      for (p_Var5 = (this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &(this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
        (**(code **)(**(long **)(p_Var5 + 2) + 0x80))();
      }
    }
  }
  if ((this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if ((this->m_external_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      __assert_fail("m_external_spk_managers.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0x947,"DBErrors wallet::CWallet::LoadWallet()");
    }
    if ((this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      __assert_fail("m_internal_spk_managers.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0x948,"DBErrors wallet::CWallet::LoadWallet()");
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock50.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return DVar2;
  }
  __stack_chk_fail();
}

Assistant:

DBErrors CWallet::LoadWallet()
{
    LOCK(cs_wallet);

    Assert(m_spk_managers.empty());
    Assert(m_wallet_flags == 0);
    DBErrors nLoadWalletRet = WalletBatch(GetDatabase()).LoadWallet(this);
    if (nLoadWalletRet == DBErrors::NEED_REWRITE)
    {
        if (GetDatabase().Rewrite("\x04pool"))
        {
            for (const auto& spk_man_pair : m_spk_managers) {
                spk_man_pair.second->RewriteDB();
            }
        }
    }

    if (m_spk_managers.empty()) {
        assert(m_external_spk_managers.empty());
        assert(m_internal_spk_managers.empty());
    }

    return nLoadWalletRet;
}